

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O2

sexp_conflict
sexp_bytevector_u32_ref_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg1,sexp_conflict arg2,
          sexp_conflict arg3)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  sexp_conflict psVar4;
  
  if ((((ulong)arg1 & 3) != 0) || (arg1->tag != 8)) {
    psVar4 = (sexp_conflict)sexp_type_exception(ctx,self,8);
    return psVar4;
  }
  if (((ulong)arg2 & 1) == 0) {
    if ((((ulong)arg2 & 2) != 0) || (arg2->tag != 0xc)) {
      psVar4 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg2);
      return psVar4;
    }
    iVar3 = (int)(arg2->value).flonum_bits[0] * (int)(arg2->value).uvector.length;
  }
  else {
    iVar3 = (int)((long)arg2 >> 1);
  }
  uVar1 = *(uint *)((long)&arg1->value + (long)iVar3 + 8);
  uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if ((((ctx->value).type.setters)->value).type.slots == arg3) {
    uVar2 = uVar1;
  }
  psVar4 = (sexp_conflict)sexp_make_unsigned_integer(ctx,uVar2,0);
  return psVar4;
}

Assistant:

sexp sexp_bytevector_u32_ref_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg1, sexp arg2, sexp arg3) {
  sexp res;
  if (! sexp_bytesp(arg1))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  res = sexp_make_unsigned_integer(ctx, bytevector_u32_ref(ctx, sexp_bytes_data(arg1), sexp_sint_value(arg2), arg3));
  return res;
}